

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

uint __thiscall ON_ErrorLog::Append(ON_ErrorLog *this,ON_ErrorEvent *error_event)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->m_event_count;
  uVar2 = 0;
  if ((ulong)uVar1 < 0x20) {
    uVar2 = uVar1 + 1;
    this->m_event_count = uVar2;
    if (this->m_events + uVar1 != error_event) {
      ON_ErrorEvent::Internal_CopyFrom(this->m_events + uVar1,error_event);
      uVar2 = this->m_event_count;
    }
    if ((uVar2 == 0x20) && (ON_ACTIVE_ERROR_LOG == this)) {
      ON_ACTIVE_ERROR_LOG = (ON_ErrorLog *)0x0;
      uVar2 = 0x20;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_ErrorLog::Append(
  const ON_ErrorEvent& error_event
)
{
  const unsigned int event_capacity = (unsigned int)(sizeof(m_events) / sizeof(m_events[0]));
  if (m_event_count >= event_capacity)
    return 0;

  if (m_event_count < event_capacity)
  {
    m_events[m_event_count++] = error_event;
    if (m_event_count == event_capacity && ON_ACTIVE_ERROR_LOG == this)
    {
      // stop wasting time logging errors
      ON_ACTIVE_ERROR_LOG = nullptr;
    }
  }
  return m_event_count;
}